

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void h2o_cache_release(h2o_cache_t *cache,h2o_cache_ref_t *ref)

{
  size_t *psVar1;
  
  LOCK();
  psVar1 = &ref->_refcnt;
  *psVar1 = *psVar1 - 1;
  UNLOCK();
  if (*psVar1 != 0) {
    return;
  }
  if ((ref->_lru_link).next == (st_h2o_linklist_t *)0x0) {
    if ((ref->_age_link).next == (st_h2o_linklist_t *)0x0) {
      if (cache->destroy_cb != (_func_void_h2o_iovec_t *)0x0) {
        (*cache->destroy_cb)(ref->value);
      }
      free((ref->key).base);
      free(ref);
      return;
    }
    __assert_fail("!h2o_linklist_is_linked(&ref->_age_link)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/cache.c"
                  ,200,"void h2o_cache_release(h2o_cache_t *, h2o_cache_ref_t *)");
  }
  __assert_fail("!h2o_linklist_is_linked(&ref->_lru_link)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/cache.c"
                ,199,"void h2o_cache_release(h2o_cache_t *, h2o_cache_ref_t *)");
}

Assistant:

void h2o_cache_release(h2o_cache_t *cache, h2o_cache_ref_t *ref)
{
    if (__sync_fetch_and_sub(&ref->_refcnt, 1) == 1) {
        assert(!h2o_linklist_is_linked(&ref->_lru_link));
        assert(!h2o_linklist_is_linked(&ref->_age_link));
        if (cache->destroy_cb != NULL)
            cache->destroy_cb(ref->value);
        free(ref->key.base);
        free(ref);
    }
}